

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

__sighandler_t __thiscall
AGSSockAPI::Beacon::signal(Beacon *this,int __sig,__sighandler_t __handler)

{
  ulong in_RAX;
  __sighandler_t p_Stack_8;
  char sig [1];
  
  p_Stack_8 = (__sighandler_t)(in_RAX & 0xffffffffffffff);
  write((this->data).fd[1],sig,1);
  return p_Stack_8;
}

Assistant:

void Beacon::signal()
{
	const char sig[] = "";
#if defined(_WIN32) && (IMPL_MODE == 1)
	send(data.fd, sig, sizeof (sig), 0);
#elif defined(_WIN32) && (IMPL_MODE == 2)
	closesocket(data.fd);
#else
	write(data.fd[1], sig, sizeof (sig));
#endif
}